

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FIReader.cpp
# Opt level: O3

string * __thiscall Assimp::FIUUIDValueImpl::toString_abi_cxx11_(FIUUIDValueImpl *this)

{
  uint *puVar1;
  uint uVar2;
  long lVar3;
  long lVar4;
  ostringstream os;
  string local_1c8;
  undefined7 uStack_1c7;
  undefined1 local_1b8 [16];
  long local_1a8 [2];
  undefined8 uStack_198;
  uint auStack_190 [22];
  ios_base local_138 [112];
  char acStack_c8 [152];
  
  if (this->strValueValid == false) {
    this->strValueValid = true;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
    *(uint *)((long)auStack_190 + *(long *)(local_1a8[0] + -0x18)) =
         *(uint *)((long)auStack_190 + *(long *)(local_1a8[0] + -0x18)) & 0xffffffb5 | 8;
    puVar1 = (uint *)((long)auStack_190 + *(long *)(local_1a8[0] + -0x18));
    *puVar1 = *puVar1 | 0x4000;
    lVar3 = *(long *)(local_1a8[0] + -0x18);
    if (acStack_c8[lVar3 + 1] == '\0') {
      std::ios::widen((char)&local_1c8 + (char)lVar3 + ' ');
      acStack_c8[lVar3 + 1] = '\x01';
    }
    acStack_c8[lVar3] = '0';
    lVar3 = (long)(this->super_FIUUIDValue).super_FIByteValue.value.
                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                  super__Vector_impl_data._M_finish -
            (long)(this->super_FIUUIDValue).super_FIByteValue.value.
                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                  super__Vector_impl_data._M_start;
    if (lVar3 != 0) {
      lVar4 = 0;
      do {
        uVar2 = (uint)lVar4 & 0xf;
        if ((0xfaaeUL >> uVar2 & 1) == 0) {
          if ((0x550UL >> uVar2 & 1) == 0) {
            if (lVar4 != 0) {
              local_1c8 = (string)0x20;
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_1a8,(char *)&local_1c8,1);
            }
          }
          else {
            local_1c8 = (string)0x2d;
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_1a8,(char *)&local_1c8,1);
          }
        }
        *(undefined8 *)((long)&uStack_198 + *(long *)(local_1a8[0] + -0x18)) = 2;
        std::ostream::operator<<
                  ((ostream *)local_1a8,
                   (uint)(this->super_FIUUIDValue).super_FIByteValue.value.
                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                         super__Vector_impl_data._M_start[lVar4]);
        lVar4 = lVar4 + 1;
      } while (lVar3 + (ulong)(lVar3 == 0) != lVar4);
    }
    std::__cxx11::stringbuf::str();
    std::__cxx11::string::operator=((string *)&this->strValue,&local_1c8);
    if ((undefined1 *)CONCAT71(uStack_1c7,local_1c8) != local_1b8) {
      operator_delete((undefined1 *)CONCAT71(uStack_1c7,local_1c8));
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
    std::ios_base::~ios_base(local_138);
  }
  return &this->strValue;
}

Assistant:

virtual const std::string &toString() const /*override*/ {
        if (!strValueValid) {
            strValueValid = true;
            std::ostringstream os;
            os << std::hex << std::uppercase << std::setfill('0');
            std::vector<uint8_t>::size_type valueSize = value.size();
            for (std::vector<uint8_t>::size_type i = 0; i < valueSize; ++i) {
                switch (i & 15) {
                case 0:
                    if (i > 0) {
                        os << ' ';
                    }
                    os << std::setw(2) << static_cast<int>(value[i]);
                    break;
                case 4:
                case 6:
                case 8:
                case 10:
                    os << '-';
                    // intentionally fall through!
                case 1:
                case 2:
                case 3:
                case 5:
                case 7:
                case 9:
                case 11:
                case 12:
                case 13:
                case 14:
                case 15:
                    os << std::setw(2) << static_cast<int>(value[i]);
                    break;
                }
            }
            strValue = os.str();
        }
        return strValue;
    }